

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_value_color_float(nk_context *ctx,char *p,nk_color color)

{
  nk_labelf(ctx,0x11,"%s: (%.2f, %.2f, %.2f, %.2f)",
            (double)((uint)color & 0xff) * 0.00392156862745098,
            (double)((uint)color >> 8 & 0xff) * 0.00392156862745098,
            (double)((uint)color >> 0x10 & 0xff) * 0.00392156862745098,
            (double)((uint)color >> 0x18) * 0.00392156862745098,p);
  return;
}

Assistant:

NK_API void
nk_value_color_float(struct nk_context *ctx, const char *p, struct nk_color color)
{
    double c[4]; nk_color_dv(c, color);
    nk_labelf(ctx, NK_TEXT_LEFT, "%s: (%.2f, %.2f, %.2f, %.2f)",
        p, c[0], c[1], c[2], c[3]);
}